

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O0

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::thread_settings>::check_limits
          (mem_cache<cppcms::impl::thread_settings> *this)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  reference piVar4;
  reverse_iterator<std::_List_iterator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
  *in_RDI;
  time_t now;
  pointer main;
  mem_cache<cppcms::impl::thread_settings> *in_stack_00000048;
  pointer in_stack_00000050;
  uint in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar5;
  iterator in_stack_ffffffffffffffc8;
  long local_18;
  iterator local_10;
  
  local_10 = (iterator)
             hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>
             ::end((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>
                    *)CONCAT17(in_stack_ffffffffffffffbf,
                               CONCAT16(in_stack_ffffffffffffffbe,
                                        CONCAT15(in_stack_ffffffffffffffbd,
                                                 CONCAT14(in_stack_ffffffffffffffbc,
                                                          in_stack_ffffffffffffffb8)))));
  time(&local_18);
  while( true ) {
    uVar5 = false;
    if (in_RDI[0x19].current._M_node != (_List_node_base *)0x0) {
      bVar1 = not_enough_memory((mem_cache<cppcms::impl::thread_settings> *)0x41b2fa);
      in_stack_ffffffffffffffbe = true;
      uVar5 = true;
      if ((!bVar1) &&
         (in_stack_ffffffffffffffbd = false, in_stack_ffffffffffffffbe = in_stack_ffffffffffffffbd,
         uVar5 = in_stack_ffffffffffffffbd,
         (_List_node_base *)(ulong)*(uint *)&in_RDI[0x18].current._M_node <=
         in_RDI[0x19].current._M_node)) {
        in_stack_ffffffffffffffbd = *(int *)&in_RDI[0x18].current._M_node != 0;
        in_stack_ffffffffffffffbe = in_stack_ffffffffffffffbd;
        uVar5 = in_stack_ffffffffffffffbd;
      }
    }
    if ((bool)uVar5 == false) break;
    bVar2 = std::
            multimap<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::less<long>,_std::allocator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>_>
            ::empty((multimap<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::less<long>,_std::allocator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>_>
                     *)0x41b364);
    bVar1 = false;
    if (!bVar2) {
      std::
      multimap<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::less<long>,_std::allocator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>_>
      ::begin((multimap<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::less<long>,_std::allocator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>_>
               *)CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffbe,
                                         CONCAT15(in_stack_ffffffffffffffbd,
                                                  (uint5)in_stack_ffffffffffffffb8))));
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
                             *)0x41b38e);
      bVar1 = ppVar3->first < local_18;
    }
    if (bVar1 == false) {
      bVar1 = std::__cxx11::
              list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
              ::empty((list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
                       *)(in_RDI + 0x15));
      if (bVar1) {
        return;
      }
      std::__cxx11::
      list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
      ::rbegin((list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
                *)in_stack_ffffffffffffffc8);
      piVar4 = std::
               reverse_iterator<std::_List_iterator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
               ::operator*(in_RDI);
      local_10 = piVar4->p_;
    }
    else {
      std::
      multimap<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::less<long>,_std::allocator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>_>
      ::begin((multimap<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator,_std::less<long>,_std::allocator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>_>
               *)CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffbe,
                                         CONCAT15(in_stack_ffffffffffffffbd,
                                                  CONCAT14(bVar1,in_stack_ffffffffffffffb8)))));
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>_>_>::iterator>_>
                             *)0x41b3c4);
      local_10 = (ppVar3->second).p_;
    }
    in_stack_ffffffffffffffc8 = local_10;
    delete_node(in_stack_00000048,in_stack_00000050);
  }
  return;
}

Assistant:

void check_limits()
	{
		pointer main=primary.end();
		time_t now;
		time(&now);

		while(size > 0 && (not_enough_memory() || (size>=limit && limit>0)))
		{
			if(!timeout.empty() && timeout.begin()->first<now) {
				main=timeout.begin()->second;
			}
			else if(!lru.empty()){
				main=*lru.rbegin();
			}
			else
				break;
			delete_node(main);
		}
	}